

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

_Bool bc_str_to_bool(char *str)

{
  int iVar1;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    iVar1 = strcmp(str,"1");
    if (iVar1 == 0) {
      str_local._7_1_ = true;
    }
    else {
      iVar1 = strcasecmp(str,"y");
      if (iVar1 == 0) {
        str_local._7_1_ = true;
      }
      else {
        iVar1 = strcasecmp(str,"yes");
        if (iVar1 == 0) {
          str_local._7_1_ = true;
        }
        else {
          iVar1 = strcasecmp(str,"true");
          if (iVar1 == 0) {
            str_local._7_1_ = true;
          }
          else {
            iVar1 = strcasecmp(str,"on");
            if (iVar1 == 0) {
              str_local._7_1_ = true;
            }
            else {
              str_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool
bc_str_to_bool(const char *str)
{
    if (str == NULL)
        return false;

    if (0 == strcmp(str, "1"))
        return true;

    if (0 == strcasecmp(str, "y"))
        return true;

    if (0 == strcasecmp(str, "yes"))
        return true;

    if (0 == strcasecmp(str, "true"))
        return true;

    if (0 == strcasecmp(str, "on"))
        return true;

    return false;
}